

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

size_t coda_revnspc(char *s,char *n,size_t len)

{
  long lVar1;
  char *x;
  char *p;
  char *b;
  size_t len_local;
  char *n_local;
  char *s_local;
  char *local_8;
  
  p = s + (len - 1);
  do {
    x = n;
    if (p <= s + -1) {
      lVar1 = (len - 1) - (long)p;
LAB_0010b330:
      local_8 = s + lVar1;
      return (size_t)local_8;
    }
    for (; *x != '\0'; x = x + 1) {
      if (*p == *x) {
        lVar1 = (len - 1) - (long)p;
        goto LAB_0010b330;
      }
    }
    p = p + -1;
  } while( true );
}

Assistant:

size_t coda_revnspc(const char *s, const char *n, size_t len)
{
	const char *b = s - 1;
	const char *p = s - 1 + len;
	const char *x;

	for (; p > b; --p)
	{
		for (x = n; *x; ++x)
		{
			if (*p == *x) return s - 1 + len - p;
		}
	}

	return s - 1 + len - p;
}